

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

void __thiscall DomUI::setElementTabStops(DomUI *this,DomTabStops *a)

{
  byte *pbVar1;
  DomTabStops *pDVar2;
  
  pDVar2 = this->m_tabStops;
  if (pDVar2 != (DomTabStops *)0x0) {
    QList<QString>::clear(&pDVar2->m_tabStop);
    QArrayDataPointer<QString>::~QArrayDataPointer(&(pDVar2->m_tabStop).d);
  }
  operator_delete(pDVar2,0x20);
  pbVar1 = (byte *)((long)&this->m_children + 1);
  *pbVar1 = *pbVar1 | 2;
  this->m_tabStops = a;
  return;
}

Assistant:

void DomUI::setElementTabStops(DomTabStops *a)
{
    delete m_tabStops;
    m_children |= TabStops;
    m_tabStops = a;
}